

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::ProcessNoImplicitCallDef(BackwardPass *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *pOVar2;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BackwardPass *this_01;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  BasicBlock *pBVar4;
  BasicBlock *pBVar5;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  BOOLEAN BVar9;
  ushort uVar10;
  undefined8 in_RAX;
  undefined4 *puVar11;
  undefined7 extraout_var;
  RegOpnd *pRVar12;
  SymOpnd *pSVar13;
  Instr *pIVar14;
  Type *ppFVar15;
  long lVar16;
  Instr *instr_00;
  uint uVar17;
  Func **ppFVar18;
  BasicBlock *this_02;
  Instr *pIVar19;
  BackwardPass *this_03;
  TempObjectTracker *this_04;
  _func_int **pp_Var20;
  Instr **ppIVar21;
  ulong uVar22;
  IRKind IVar23;
  StackSym *pSVar24;
  Iterator IStack_a8;
  Iterator IStack_98;
  BackwardPass *pBStack_88;
  Instr *pIStack_80;
  Instr *pIStack_78;
  Instr *pIStack_70;
  BackwardPass *pBStack_68;
  BackwardPass *pBStack_60;
  ulong uStack_58;
  Instr *pIStack_50;
  Opnd *pOStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)0x3e3c12;
    Js::Throw::LogAssert();
    pcStack_40 = (code *)0x3e3c22;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    pcStack_40 = (code *)0x3e3c4a;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1183,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar7) goto LAB_003e41af;
    *puVar11 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)0x3e3c6c;
    Js::Throw::LogAssert();
    pcStack_40 = (code *)0x3e3c7c;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    pcStack_40 = (code *)0x3e3ca4;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1184,"(instr)","instr");
    if (!bVar7) goto LAB_003e41af;
    *puVar11 = 0;
  }
  pOVar2 = instr->m_dst;
  if (pOVar2 == (Opnd *)0x0) {
    return;
  }
  pcStack_40 = (code *)0x3e3cc8;
  OVar8 = IR::Opnd::GetKind(pOVar2);
  if (OVar8 == OpndKindSym) {
    pcStack_40 = (code *)0x3e3d48;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e3d5a;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e3d6a;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e3d92;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_003e41af;
      *puVar11 = 0;
    }
    pp_Var20 = pOVar2[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var20 + 0x14) != '\x02') {
      return;
    }
  }
  else {
    if (OVar8 != OpndKindReg) {
      return;
    }
    pcStack_40 = (code *)0x3e3ce0;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e3cf2;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e3d02;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e3d2a;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_003e41af;
      *puVar11 = 0;
    }
    pp_Var20 = pOVar2[1]._vptr_Opnd;
  }
  pcStack_40 = (code *)0x3e3dc7;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallUses,*(BVIndex *)(pp_Var20 + 2));
  this_00 = this->currentBlock->noImplicitCallNoMissingValuesUses;
  if (BVar9 == '\0') {
    pcStack_40 = (code *)0x3e3e89;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test(this_00,*(BVIndex *)(pp_Var20 + 2));
    if (BVar9 != '\0') {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e3e9b;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e3eab;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e3ed3;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a1,
                         "(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id))",
                         "!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id)");
      if (!bVar7) goto LAB_003e41af;
      *puVar11 = 0;
    }
    pcStack_40 = (code *)0x3e3ef7;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallNativeArrayUses,*(BVIndex *)(pp_Var20 + 2))
    ;
    if (BVar9 != '\0') {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e3f09;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e3f19;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e3f41;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a2,
                         "(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id))",
                         "!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id)");
      if (!bVar7) goto LAB_003e41af;
      *puVar11 = 0;
    }
    pcStack_40 = (code *)0x3e3f65;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                       *(BVIndex *)(pp_Var20 + 2));
    if (BVar9 != '\0') {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e3f77;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e3f87;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e3faf;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a3,
                         "(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id))"
                         ,
                         "!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id)"
                        );
      if (!bVar7) goto LAB_003e41af;
      *puVar11 = 0;
    }
    pcStack_40 = (code *)0x3e3fd3;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallArrayLengthSymUses,
                       *(BVIndex *)(pp_Var20 + 2));
    if (BVar9 == '\0') {
      return;
    }
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)0x3e3fe9;
    Js::Throw::LogAssert();
    pcStack_40 = (code *)0x3e3ff9;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    pcStack_40 = (code *)0x3e4021;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x11a4,
                       "(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id))",
                       "!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id)");
    if (bVar7) {
      *puVar11 = 0;
      return;
    }
    goto LAB_003e41af;
  }
  pcStack_40 = (code *)0x3e3de4;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear(this_00,*(BVIndex *)(pp_Var20 + 2));
  uVar22 = CONCAT71(extraout_var,BVar9) & 0xffffffff;
  pcStack_40 = (code *)0x3e3dfc;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallNativeArrayUses,*(BVIndex *)(pp_Var20 + 2));
  uStack_38 = CONCAT17(BVar9,(undefined7)uStack_38);
  pcStack_40 = (code *)0x3e3e14;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                     *(BVIndex *)(pp_Var20 + 2));
  uStack_38._0_7_ = CONCAT16(BVar9,(undefined6)uStack_38);
  pIVar19 = (Instr *)(ulong)*(uint *)(pp_Var20 + 2);
  pcStack_40 = (code *)0x3e3e2c;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallArrayLengthSymUses,*(uint *)(pp_Var20 + 2));
  uStack_38._0_6_ = CONCAT15(BVar9,(undefined5)uStack_38);
  this_01 = (BackwardPass *)instr->m_src1;
  if (this_01 == (BackwardPass *)0x0) {
    return;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    pcStack_40 = (code *)0x3e3e4d;
    bVar7 = OpCodeAttr::NonIntTransfer(instr->m_opcode);
    if (!bVar7) {
      return;
    }
  }
  pcStack_40 = (code *)0x3e3e5d;
  OVar8 = IR::Opnd::GetKind(pOVar2);
  if (OVar8 == OpndKindReg) {
    pcStack_40 = (code *)0x3e3e6d;
    OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar8 != OpndKindReg) goto LAB_003e4034;
    pcStack_40 = (code *)0x3e3e7f;
    bVar7 = OpCodeAttr::NonIntTransfer(instr->m_opcode);
  }
  else {
LAB_003e4034:
    pcStack_40 = (code *)0x3e403c;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 == OpndKindReg) {
      pcStack_40 = (code *)0x3e4048;
      OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
      if (OVar8 != OpndKindSym) goto LAB_003e405e;
      pcStack_40 = (code *)0x3e4054;
      pSVar13 = IR::Opnd::AsSymOpnd((Opnd *)this_01);
      if (pSVar13->m_sym->m_kind != SymKindProperty) goto LAB_003e405e;
    }
    else {
LAB_003e405e:
      pcStack_40 = (code *)0x3e4066;
      OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
      if (OVar8 != OpndKindReg) {
        return;
      }
      uStack_38._0_4_ = CONCAT22((pOVar2->m_valueType).field_0.bits,(undefined2)uStack_38);
      pcStack_40 = (code *)0x3e407f;
      bVar7 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&uStack_38 + 2));
      if (!bVar7) {
        return;
      }
    }
    pcStack_40 = (code *)0x3e408f;
    bVar7 = IR::Instr::TransfersSrcValue(instr);
  }
  if (bVar7 == false) {
    return;
  }
  pcStack_40 = (code *)0x3e409f;
  this_03 = this_01;
  OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar8 == OpndKindSym) {
    pcStack_40 = (code *)0x3e40c5;
    pSVar13 = IR::Opnd::AsSymOpnd((Opnd *)this_01);
    pSVar24 = (StackSym *)pSVar13->m_sym;
    if ((pSVar24->super_Sym).m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e40de;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e40ee;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e4116;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11d5,"(srcSym->IsPropertySym())","srcSym->IsPropertySym()");
      if (!bVar7) {
LAB_003e41af:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar11 = 0;
    }
LAB_003e4125:
    pcStack_40 = (code *)0x3e4139;
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->currentBlock->noImplicitCallUses,(pSVar24->super_Sym).m_id);
    if ((char)uVar22 != '\0') {
      pcStack_40 = (code *)0x3e4152;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallNoMissingValuesUses,(pSVar24->super_Sym).m_id);
    }
    if (uStack_38._7_1_ != '\0') {
      pcStack_40 = (code *)0x3e416c;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallNativeArrayUses,(pSVar24->super_Sym).m_id);
    }
    if (uStack_38._6_1_ != '\0') {
      pcStack_40 = (code *)0x3e4186;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                 (pSVar24->super_Sym).m_id);
    }
    if (uStack_38._5_1_ != '\0') {
      pcStack_40 = (code *)0x3e41a0;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallArrayLengthSymUses,(pSVar24->super_Sym).m_id);
    }
    return;
  }
  if (OVar8 == OpndKindReg) {
    pcStack_40 = (code *)0x3e40b7;
    pRVar12 = IR::Opnd::AsRegOpnd((Opnd *)this_01);
    pSVar24 = pRVar12->m_sym;
    goto LAB_003e4125;
  }
  pcStack_40 = ProcessBailOnNoProfile;
  ProcessNoImplicitCallDef();
  pBStack_68 = this;
  pBStack_60 = this_01;
  uStack_58 = uVar22;
  pIStack_50 = instr;
  pOStack_48 = pOVar2;
  pcStack_40 = (code *)&stack0xfffffffffffffff8;
  if (this_03->tag != BackwardPhase) {
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)&stack0xfffffffffffffff8;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2085,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase");
    if (!bVar7) goto LAB_003e4967;
    *puVar11 = 0;
  }
  if (pIVar19->m_opcode != BailOnNoProfile) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2086,"(instr->m_opcode == Js::OpCode::BailOnNoProfile)",
                       "instr->m_opcode == Js::OpCode::BailOnNoProfile");
    if (!bVar7) goto LAB_003e4967;
    *puVar11 = 0;
  }
  if ((pIVar19->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2087,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar7) goto LAB_003e4967;
    *puVar11 = 0;
  }
  if (this_02 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2088,"(block)","block");
    if (!bVar7) goto LAB_003e4967;
    *puVar11 = 0;
  }
  if (this_03->currentPrePassLoop != (Loop *)0x0) {
    return;
  }
  if ((this_03->currentRegion != (Region *)0x0) &&
     ((byte)(this_03->currentRegion->type - RegionTypeCatch) < 2)) {
    return;
  }
  pIStack_78 = pIVar19->m_prev;
  IVar23 = pIStack_78->m_kind;
  pIStack_70 = pIVar19;
  if (((IVar23 == InstrKindProfiledLabel) || (IVar23 == InstrKindLabel)) &&
     (((ulong)pIStack_78[1].m_func & 2) != 0)) {
    if (this_03->tag != BackwardPhase) {
      return;
    }
    bVar7 = SatisfyMarkTempObjectsConditions(this_03);
    if (!bVar7) {
      return;
    }
    this_04 = this_02->tempObjectTracker;
    pIVar19 = pIStack_70;
  }
  else {
    ppIVar21 = &pIVar19->m_prev;
    pBStack_88 = this_03;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIStack_80 = (Instr *)0x0;
    while( true ) {
      pIVar19 = pIStack_78;
      if ((IVar23 < InstrKindExit) && ((0x68U >> (IVar23 & 0x1f) & 1) != 0)) goto LAB_003e4476;
      bVar7 = IR::Instr::DontHoistBailOnNoProfileAboveInGeneratorFunction(pIStack_78);
      if ((bVar7) && (bVar7 = pIStack_80 != (Instr *)0x0, pIStack_80 = pIVar19, bVar7)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20ab,"(insertionPointForGenerator == nullptr)",
                           "insertionPointForGenerator == nullptr");
        if (!bVar7) goto LAB_003e4967;
        *puVar11 = 0;
        pIStack_80 = pIVar19;
      }
      uVar17 = pIVar19->m_opcode - 0x248;
      if ((uVar17 < 7) && ((0x67U >> (uVar17 & 0x1f) & 1) != 0)) break;
      bVar7 = OpCodeAttr::CallInstr(pIVar19->m_opcode);
      pIVar14 = pIVar19->m_prev;
      if ((bVar7) && (pIVar14->m_opcode != BailOnNoProfile)) break;
      IVar23 = pIVar14->m_kind;
      pIStack_78 = pIVar14;
    }
    IVar23 = pIVar19->m_kind;
LAB_003e4476:
    if ((IVar23 != InstrKindLabel) && (IVar23 != InstrKindProfiledLabel)) {
LAB_003e490d:
      BasicBlock::RemoveInstr(this_02,pIStack_70);
      return;
    }
    pIVar14 = IR::Instr::GetNextRealInstrOrLabel(pIStack_78);
    pIVar19 = pIStack_70;
    if ((pIVar14->m_opcode == Ld_A) &&
       (OVar8 = IR::Opnd::GetKind(pIVar14->m_dst), pIVar19 = pIStack_70, OVar8 == OpndKindReg)) {
      pOVar2 = pIVar14->m_dst;
      OVar8 = IR::Opnd::GetKind(pOVar2);
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) {
LAB_003e4967:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar11 = 0;
      }
      pIVar19 = pIStack_70;
      if (((ushort)pOVar2[1].m_valueType.field_0 & 8) != 0) goto LAB_003e490d;
    }
    while( true ) {
      pIVar14 = *ppIVar21;
      if ((pIVar14->m_kind < 7) && ((0x68U >> (pIVar14->m_kind & 0x1f) & 1) != 0)) break;
      if (pIVar14->m_opcode == BailOnNoProfile) {
        if ((pIVar14->field_0x38 & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x20e4,"(!curInstr->HasBailOutInfo())","!curInstr->HasBailOutInfo()");
          if (!bVar7) goto LAB_003e4967;
          *puVar11 = 0;
        }
        pIVar14 = pIVar14->m_next;
        IR::Instr::Remove(pIVar14->m_prev);
      }
      ppIVar21 = &pIVar14->m_prev;
    }
    IR::Instr::Unlink(pIVar19);
    IStack_a8.list =
         &(this_02->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    IStack_a8.current = &(IStack_a8.list)->super_SListNodeBase<Memory::ArenaAllocator>;
LAB_003e45ed:
    do {
      if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IStack_a8.current ==
          (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_003e4967;
        *puVar11 = 0;
      }
      pSVar3 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                &(IStack_a8.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar3 == IStack_a8.list) goto LAB_003e48c4;
      IStack_a8.current = (NodeBase *)pSVar3;
      ppFVar15 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           (&IStack_a8);
      pBVar4 = (*ppFVar15)->predBlock;
      if (pBVar4 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20f3,"(pred)","pred");
        if (!bVar7) goto LAB_003e4967;
        *puVar11 = 0;
      }
    } while (((this_02->field_0x18 & 4) != 0) && (pBVar4->loop == this_02->loop));
    pIVar19 = pBVar4->firstInstr;
    IVar23 = pIVar19->m_kind;
    if ((IVar23 != InstrKindLabel) && (IVar23 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar7) goto LAB_003e4967;
      *puVar11 = 0;
    }
    if ((Region *)pIVar19[1].m_src2 == pBStack_88->currentRegion) {
      IStack_98.list =
           &(pBVar4->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      IStack_98.current = &(IStack_98.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      do {
        if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IStack_98.current ==
            (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) goto LAB_003e4967;
          *puVar11 = 0;
        }
        pSVar3 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  &(IStack_98.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (pSVar3 == IStack_98.list) {
          if (pIStack_80 != (Instr *)0x0) break;
          pBVar5 = pBVar4->next;
          ppFVar18 = (Func **)&pBVar5->firstInstr;
          if (pBVar5 == (BasicBlock *)0x0) {
            ppFVar18 = &pBVar4->func;
          }
          lVar16 = 0x18;
          if (pBVar5 == (BasicBlock *)0x0) {
            lVar16 = 0xd0;
          }
          pIVar19 = *(Instr **)((long)&(*ppFVar18)->m_alloc + lVar16);
          instr_00 = IR::Instr::Copy(pIStack_70,true);
          IVar23 = pIVar19->m_kind;
          if ((((IVar23 == InstrKindBranch) || (IVar23 == InstrKindExit)) ||
              (OVar1 = pIVar19->m_opcode, OVar1 - 0x23 < 3)) || (OVar1 - 0x173 < 2)) {
            if (pIVar19->m_prev->m_opcode != BailOnNoProfile) {
              if ((IVar23 == InstrKindBranch) && (((ulong)pIVar19[1]._vptr_Instr & 2) == 0)) {
                instr_00->m_func = pIVar19->m_func;
                IR::Instr::InsertBefore(pIVar19,instr_00);
              }
              break;
            }
          }
          else if (OVar1 != BailOnNoProfile) {
            instr_00->m_func = pIVar19->m_func;
            IR::Instr::InsertAfter(pIVar19,instr_00);
            break;
          }
          IR::Instr::Free(instr_00);
          break;
        }
        IStack_98.current = (NodeBase *)pSVar3;
        ppFVar15 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             (&IStack_98);
        pBVar5 = (*ppFVar15)->succBlock;
        if (pBVar5 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x2105,"(predSucc)","predSucc");
          if (!bVar7) goto LAB_003e4967;
          *puVar11 = 0;
        }
      } while ((pBVar5 == this_02) || ((pBVar5->field_0x18 & 0x80) != 0));
      goto LAB_003e45ed;
    }
LAB_003e48c4:
    pIVar19 = pIStack_70;
    if (this_02->number == 0) {
      IR::Instr::Free(pIStack_70);
      return;
    }
    *(byte *)&pIStack_78[1].m_func = *(byte *)&pIStack_78[1].m_func | 0x22;
    pIStack_70->m_func = pIVar14->m_func;
    if (pIStack_80 == (Instr *)0x0) {
      IR::Instr::InsertAfter(pIVar14,pIStack_70);
      uVar10 = (ushort)*(undefined4 *)&this_02->field_0x18 | 0x80;
    }
    else {
      IR::Instr::InsertAfter(pIStack_80,pIStack_70);
      uVar10 = *(ushort *)&this_02->field_0x18 & 0xff7f;
    }
    *(ushort *)&this_02->field_0x18 = uVar10;
    if (pBStack_88->tag != BackwardPhase) {
      return;
    }
    bVar7 = SatisfyMarkTempObjectsConditions(pBStack_88);
    if (!bVar7) {
      return;
    }
    this_04 = this_02->tempObjectTracker;
  }
  ObjectTemp::ProcessBailOnNoProfile(&this_04->super_ObjectTemp,pIVar19);
  return;
}

Assistant:

void
BackwardPass::ProcessNoImplicitCallDef(IR::Instr *const instr)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(instr);

    IR::Opnd *const dst = instr->GetDst();
    if(!dst)
    {
        return;
    }

    Sym *dstSym;
    switch(dst->GetKind())
    {
        case IR::OpndKindReg:
            dstSym = dst->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            dstSym = dst->AsSymOpnd()->m_sym;
            if(!dstSym->IsPropertySym())
            {
                return;
            }
            break;

        default:
            return;
    }

    if(!currentBlock->noImplicitCallUses->TestAndClear(dstSym->m_id))
    {
        Assert(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id));
        return;
    }
    const bool transferNoMissingValuesUse = !!currentBlock->noImplicitCallNoMissingValuesUses->TestAndClear(dstSym->m_id);
    const bool transferNativeArrayUse = !!currentBlock->noImplicitCallNativeArrayUses->TestAndClear(dstSym->m_id);
    const bool transferJsArrayHeadSegmentSymUse =
        !!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->TestAndClear(dstSym->m_id);
    const bool transferArrayLengthSymUse = !!currentBlock->noImplicitCallArrayLengthSymUses->TestAndClear(dstSym->m_id);

    IR::Opnd *const src = instr->GetSrc1();

    // Stop attempting to transfer noImplicitCallUses symbol if the instr is not a transfer instr (based on the opcode's 
    // flags) or does not have the attributes to be a transfer instr (based on the existance of src and src2).
    if(!src || (instr->GetSrc2() && !OpCodeAttr::NonIntTransfer(instr->m_opcode)))
    {
        return;
    }
    if(dst->IsRegOpnd() && src->IsRegOpnd())
    {
        if(!OpCodeAttr::NonIntTransfer(instr->m_opcode))
        {
            return;
        }
    }
    else if(
        !(
            // LdFld or similar
            (dst->IsRegOpnd() && src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym()) ||

            // StFld or similar. Don't transfer a field opnd from StFld into the reg opnd src unless the field's value type is
            // definitely array or object with array, because only those value types require implicit calls to be disabled as
            // long as they are live. Other definite value types only require implicit calls to be disabled as long as a live
            // field holds the value, which is up to the StFld when going backwards.
            (src->IsRegOpnd() && dst->GetValueType().IsArrayOrObjectWithArray())
        ) ||
        !instr->TransfersSrcValue())
    {
        return;
    }

    Sym *srcSym = nullptr;
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            srcSym = src->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            srcSym = src->AsSymOpnd()->m_sym;
            Assert(srcSym->IsPropertySym());
            break;

        default:
            Assert(false);
            __assume(false);
    }

    currentBlock->noImplicitCallUses->Set(srcSym->m_id);
    if(transferNoMissingValuesUse)
    {
        currentBlock->noImplicitCallNoMissingValuesUses->Set(srcSym->m_id);
    }
    if(transferNativeArrayUse)
    {
        currentBlock->noImplicitCallNativeArrayUses->Set(srcSym->m_id);
    }
    if(transferJsArrayHeadSegmentSymUse)
    {
        currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Set(srcSym->m_id);
    }
    if(transferArrayLengthSymUse)
    {
        currentBlock->noImplicitCallArrayLengthSymUses->Set(srcSym->m_id);
    }
}